

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_encoder.cc
# Opt level: O0

Status * __thiscall draco::PointCloudEncoder::EncodeMetadata(PointCloudEncoder *this)

{
  bool bVar1;
  GeometryMetadata *pGVar2;
  long in_RSI;
  Status *in_RDI;
  MetadataEncoder metadata_encoder;
  Code code;
  Status *this_00;
  GeometryMetadata *in_stack_ffffffffffffffb8;
  EncoderBuffer *in_stack_ffffffffffffffc0;
  MetadataEncoder *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  MetadataEncoder local_11 [17];
  
  pGVar2 = PointCloud::GetMetadata((PointCloud *)0x1af3ee);
  if (pGVar2 == (GeometryMetadata *)0x0) {
    OkStatus();
  }
  else {
    MetadataEncoder::MetadataEncoder(local_11);
    this_00 = *(Status **)(in_RSI + 0x58);
    PointCloud::GetMetadata((PointCloud *)0x1af424);
    bVar1 = MetadataEncoder::EncodeGeometryMetadata
                      (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
                      );
    if (bVar1) {
      OkStatus();
    }
    else {
      code = (Code)((ulong)&stack0xffffffffffffffc7 >> 0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,
                 (allocator<char> *)in_stack_ffffffffffffffc0);
      Status::Status(this_00,code,(string *)0x1af477);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
    }
  }
  return in_RDI;
}

Assistant:

Status PointCloudEncoder::EncodeMetadata() {
  if (!point_cloud_->GetMetadata()) {
    return OkStatus();
  }
  MetadataEncoder metadata_encoder;
  if (!metadata_encoder.EncodeGeometryMetadata(buffer_,
                                               point_cloud_->GetMetadata())) {
    return Status(Status::DRACO_ERROR, "Failed to encode metadata.");
  }
  return OkStatus();
}